

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O1

void __thiscall xmrig::FailoverStrategy::stop(FailoverStrategy *this)

{
  pointer ppIVar1;
  IClient **pool;
  pointer ppIVar2;
  
  ppIVar1 = (this->m_pools).super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->m_pools).
                 super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar2 != ppIVar1; ppIVar2 = ppIVar2 + 1) {
    (*(*ppIVar2)->_vptr_IClient[2])();
  }
  this->m_index = 0;
  this->m_active = -1;
  (*this->m_listener->_vptr_IStrategyListener[5])(this->m_listener,this);
  return;
}

Assistant:

void xmrig::FailoverStrategy::stop()
{
    for (auto &pool : m_pools) {
        pool->disconnect();
    }

    m_index  = 0;
    m_active = -1;

    m_listener->onPause(this);
}